

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Edge *graph;
  time_t tVar3;
  ulong uVar4;
  ulong uVar5;
  uint graphSize;
  char *__format;
  long lVar6;
  int local_78;
  Solution returns;
  
  name = *argv;
  graph = (Edge *)malloc((long)argc * 8 - 8);
  load_buffer();
  if (argc == 1) {
    clean_loaded_buffer();
    __format = "%s ERROR: graph has to have at least one edge\n";
  }
  else {
    iVar1 = increment_state();
    if (iVar1 == 0) {
      graphSize = argc - 1;
      tVar3 = time((time_t *)0x0);
      iVar1 = get_state();
      srand((int)tVar3 + iVar1 * 1000);
      returns.edges[0].start = 0;
      local_78 = 0;
      for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
        iVar1 = __isoc99_sscanf(argv[lVar6],"%d-%d",&returns,&local_78);
        if (((iVar1 != 2) || (returns.edges[0].start < 0)) || (local_78 < 0)) {
          clean_loaded_buffer();
          __format = 
          "%s ERROR: edge format has to be \'node\'-\'node\'\nall nodes have to be a positiv integer values\n\n"
          ;
          goto LAB_00101446;
        }
        graph[lVar6 + -1].start = returns.edges[0].start;
        graph[lVar6 + -1].end = local_78;
      }
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (int)graphSize) {
        uVar5 = (ulong)graphSize;
      }
      iVar1 = 0;
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        if (iVar1 < graph[uVar4].start) {
          iVar1 = graph[uVar4].start;
        }
        if (iVar1 < graph[uVar4].end) {
          iVar1 = graph[uVar4].end;
        }
      }
      do {
        do {
          iVar2 = get_state();
          if (iVar2 < 1) {
            free(graph);
            sem_post((sem_t *)free_sem);
            clean_loaded_buffer();
            exit(0);
          }
          calculate_one_solution(&returns,graphSize,graph,iVar1 + 1);
        } while (7 < returns.amount);
        iVar2 = circ_buf_write(&returns);
      } while (iVar2 == 0);
      __format = "%s ERROR: error writing to shared memory\n";
    }
    else {
      __format = "%s ERROR: couldn\'t increment system state\n";
    }
  }
LAB_00101446:
  fprintf(_stderr,__format,name);
  exit(1);
}

Assistant:

int main(int argc, const char **argv)
{
    name = argv[0];
    Edge *graph = malloc(sizeof(Edge) * (argc - 1));

    load_buffer();

    if (1 == argc)
    {
        clean_loaded_buffer();
        ERROR_EXIT("graph has to have at least one edge");
    }

    if (increment_state() != 0)
    {
        ERROR_EXIT("couldn't increment system state");
    }
    srand(time(0) + get_state() * 1000);

    read_input(argc, argv, graph);

    int amountVertices = get_max_node(graph, argc-1);

    int state;
    while ((state = get_state()) > 0)
    {
        Solution returns = calculate_one_solution(argc-1, graph, amountVertices);

        if (returns.amount < MAXRETURN)
        {
#ifdef DEBUG
            printEdge(returns.edges, returns.amount);
#endif
            if (circ_buf_write(&returns) != 0)
            {
                ERROR_EXIT("error writing to shared memory");
            }
        }
        else
        {
#ifdef DEBUG
            fprintf(stdout, "Solution too Big");
#endif
        }
    }

    free(graph);
    sem_post(free_sem);

    clean_loaded_buffer();
    exit(EXIT_SUCCESS);
}